

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVec.cpp
# Opt level: O3

void __thiscall FeatureVec::FeatureVec(FeatureVec *this,size_t num_features,float initial_value)

{
  pointer pfVar1;
  undefined1 auVar2 [16];
  allocator_type local_39;
  undefined1 local_38 [16];
  pointer local_28;
  float local_14;
  
  auVar2._0_12_ = ZEXT812(0);
  auVar2._12_4_ = 0;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar2._0_8_;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)auVar2._8_8_;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_14 = initial_value;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38,num_features,&local_14,&local_39);
  pfVar1 = (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_38._0_8_;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_38._8_8_;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_28;
  local_38 = ZEXT816(0) << 0x20;
  local_28 = (pointer)0x0;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
    if ((pointer)local_38._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_38._0_8_);
    }
  }
  return;
}

Assistant:

FeatureVec::FeatureVec(size_t num_features, float initial_value) {
  values = std::vector<float>(num_features, initial_value);
}